

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::ByteToHex_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar byte)

{
  char local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char local_22;
  byte local_21;
  int local_20;
  char c;
  uchar rest;
  int i;
  uchar byte_local;
  cmUuid *this_local;
  string *result;
  
  c = '\0';
  rest = byte;
  _i = this;
  this_local = (cmUuid *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    local_21 = rest % 0x10;
    rest = rest / 0x10;
    if (local_21 < 10) {
      local_69 = local_21 + 0x30;
    }
    else {
      local_69 = local_21 + 0x57;
    }
    local_22 = local_69;
    std::operator+(&local_48,local_69,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::ByteToHex(unsigned char byte) const
{
  std::string result;
  for(int i = 0; i < 2; ++i)
    {
    unsigned char rest = byte % 16;
    byte /= 16;

    char c = (rest < 0xA) ?
      char('0' + rest) :
      char('a' + (rest - 0xA));

    result = c + result;
    }

  return result;
}